

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_string_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  undefined8 in_RAX;
  uint uVar6;
  uint uVar7;
  flatbuffers_uoffset_t base;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar5 = get_offset_field(td,id,required,&local_14);
  if (local_14 != 0 && iVar5 == 0) {
    pvVar4 = td->buf;
    iVar1 = *(int *)((long)pvVar4 + (ulong)local_14);
    uVar7 = iVar1 + local_14;
    iVar5 = 0x10;
    if (local_14 < uVar7) {
      uVar2 = td->end;
      if ((uVar7 & 3) == 0 && (ulong)uVar7 + 4 <= (ulong)uVar2) {
        uVar6 = *(uint *)((long)pvVar4 + (ulong)uVar7);
        if (uVar6 < 0x40000000 && (uVar7 & 3) == 0) {
          iVar5 = 0x1a;
          if (uVar6 * 4 <= (uVar2 - uVar7) - 4) {
            if (uVar6 != 0) {
              uVar7 = iVar1 + local_14;
              iVar5 = ((uVar2 - iVar1) - local_14) + -8;
              do {
                uVar7 = uVar7 + 4;
                iVar1 = *(int *)((long)pvVar4 + (ulong)uVar7);
                uVar3 = uVar7 + iVar1;
                if (uVar3 <= uVar7) {
                  return 0x11;
                }
                if ((ulong)uVar2 < (ulong)uVar3 + 4) {
                  return 0x11;
                }
                if ((uVar3 & 3) != 0) {
                  return 0x11;
                }
                uVar3 = *(uint *)((long)pvVar4 + (ulong)uVar3);
                if ((uint)(iVar5 - iVar1) <= uVar3) {
                  return 8;
                }
                if (*(char *)((long)pvVar4 + (ulong)uVar3 + (ulong)(iVar1 + uVar7 + 4)) != '\0') {
                  return 7;
                }
                iVar5 = iVar5 + -4;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            iVar5 = 0;
          }
        }
        else {
          iVar5 = (uint)((uVar7 & 3) == 0) * 9 + 0x10;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int flatcc_verify_string_vector_field(flatcc_table_verifier_descriptor_t *td,
    voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string_vector(td->buf, td->end, base, read_uoffset(td->buf, base));
}